

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void oslar_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint uVar1;
  
  uVar1 = (uint)value;
  if (ri->state == 0) {
    uVar1 = (uint)(value == 0xc5acce55);
  }
  (env->cp15).oslsr_el1 = (ulong)((uint)(env->cp15).oslsr_el1 & 0xfffffffd) + (ulong)(uVar1 & 1) * 2
  ;
  return;
}

Assistant:

static void oslar_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    /* Writes to OSLAR_EL1 may update the OS lock status, which can be
     * read via a bit in OSLSR_EL1.
     */
    int oslock;

    if (ri->state == ARM_CP_STATE_AA32) {
        oslock = (value == 0xC5ACCE55);
    } else {
        oslock = value & 1;
    }

    env->cp15.oslsr_el1 = deposit32(env->cp15.oslsr_el1, 1, 1, oslock);
}